

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_linked_definitions_section.hpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::
linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::end_array(linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
            *this)

{
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  *pvVar1;
  const_iterator begin;
  pointer pvVar2;
  pointer pvVar3;
  tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  this_00;
  pointer __p;
  error_code eVar4;
  __uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  local_30;
  _Head_base<0UL,_pstore::repo::linked_definitions_creation_dispatcher_*,_false> local_28;
  
  pvVar1 = (this->ld_).ptr_;
  begin = (pvVar1->
          super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (pvVar1->
           super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (pvVar1->
           super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
           )._M_impl.super__Vector_impl_data._M_start;
  this_00.
  super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        )operator_new(0x20);
  repo::linked_definitions_creation_dispatcher::linked_definitions_creation_dispatcher
            ((linked_definitions_creation_dispatcher *)
             this_00.
             super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
             .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl
             ,begin,(const_iterator)(((long)pvVar2 - (long)pvVar3) + (long)begin));
  local_28._M_head_impl = (linked_definitions_creation_dispatcher *)0x0;
  local_30._M_t.
  super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
       (tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        )(tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          )this_00.
           super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
           .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
  ::
  emplace_back<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>
            ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
              *)((this->out_).ptr_)->container,
             (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
              *)&local_30);
  if ((_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
       )local_30._M_t.
        super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl !=
      (section_creation_dispatcher *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                          .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>
                          ._M_head_impl + 8))();
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
       (tuple<pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        )(_Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          )0x0;
  std::
  unique_ptr<pstore::repo::linked_definitions_creation_dispatcher,_std::default_delete<pstore::repo::linked_definitions_creation_dispatcher>_>
  ::~unique_ptr((unique_ptr<pstore::repo::linked_definitions_creation_dispatcher,_std::default_delete<pstore::repo::linked_definitions_creation_dispatcher>_>
                 *)&local_28);
  eVar4 = rule::pop(&this->super_rule);
  return eVar4;
}

Assistant:

std::error_code linked_definitions_section<OutputIterator>::end_array () {
                auto const * const data = ld_->data ();
                *out_ = std::make_unique<repo::linked_definitions_creation_dispatcher> (
                    data, data + ld_->size ());
                return pop ();
            }